

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gremedy.cpp
# Opt level: O0

void Draw(void)

{
  if (GLAD_GL_GREMEDY_string_marker != 0) {
    (*glad_glStringMarkerGREMEDY)(0,"Draw");
  }
  (*glad_glClear)(0x4000);
  (*glad_glBegin)(4);
  (*glad_glColor3f)(0.8,0.0,0.0);
  (*glad_glVertex3f)(-0.9,-0.9,-30.0);
  (*glad_glColor3f)(0.0,0.9,0.0);
  (*glad_glVertex3f)(0.9,-0.9,-30.0);
  (*glad_glColor3f)(0.0,0.0,0.7);
  (*glad_glVertex3f)(0.0,0.9,-30.0);
  (*glad_glEnd)();
  (*glad_glFlush)();
  if (GLAD_GL_GREMEDY_frame_terminator != 0) {
    (*glad_glFrameTerminatorGREMEDY)();
  }
  glfwSwapBuffers(window);
  return;
}

Assistant:

static void Draw(void)
{
   if (GLAD_GL_GREMEDY_string_marker) {
      glStringMarkerGREMEDY(0, __FUNCTION__);
   }

   glClear(GL_COLOR_BUFFER_BIT); 

   glBegin(GL_TRIANGLES);
   glColor3f(.8,0,0); 
   glVertex3f(-0.9, -0.9, -30.0);
   glColor3f(0,.9,0); 
   glVertex3f( 0.9, -0.9, -30.0);
   glColor3f(0,0,.7); 
   glVertex3f( 0.0,  0.9, -30.0);
   glEnd();

   glFlush();

   if (GLAD_GL_GREMEDY_frame_terminator) {
      glFrameTerminatorGREMEDY();
   }

   glfwSwapBuffers(window);
}